

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

void __thiscall spvtools::opt::analysis::FloatConstant::~FloatConstant(FloatConstant *this)

{
  ScalarConstant::~ScalarConstant(&this->super_ScalarConstant);
  operator_delete(this,0x28);
  return;
}

Assistant:

FloatConstant(const Float* ty, const std::vector<uint32_t>& w)
      : ScalarConstant(ty, w) {}